

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageSync(Fts5Storage *p)

{
  sqlite3_int64 iRowid;
  Fts5Index *p_00;
  int iVar1;
  
  iRowid = p->pConfig->db->lastRowid;
  if (p->bTotalsValid != 0) {
    iVar1 = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
    if (iVar1 != 0) goto LAB_001bf80d;
  }
  p_00 = p->pIndex;
  fts5IndexFlush(p_00);
  fts5CloseReader(p_00);
  iVar1 = p_00->rc;
  p_00->rc = 0;
LAB_001bf80d:
  sqlite3_set_last_insert_rowid(p->pConfig->db,iRowid);
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageSync(Fts5Storage *p){
  int rc = SQLITE_OK;
  i64 iLastRowid = sqlite3_last_insert_rowid(p->pConfig->db);
  if( p->bTotalsValid ){
    rc = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSync(p->pIndex);
  }
  sqlite3_set_last_insert_rowid(p->pConfig->db, iLastRowid);
  return rc;
}